

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.cpp
# Opt level: O0

void __thiscall Apple::ADB::Bus::Bus(Bus *this,HalfCycles clock_speed)

{
  double dVar1;
  Bus *this_local;
  HalfCycles clock_speed_local;
  
  this_local = (Bus *)clock_speed.super_WrappedInt<HalfCycles>.length_;
  HalfCycles::HalfCycles(&this->time_in_state_);
  HalfCycles::HalfCycles(&this->time_since_get_state_);
  dVar1 = WrappedInt<HalfCycles>::as<double>((WrappedInt<HalfCycles> *)&this_local);
  this->half_cycles_to_microseconds_ = 1000000.0 / dVar1;
  std::vector<Apple::ADB::Bus::Device_*,_std::allocator<Apple::ADB::Bus::Device_*>_>::vector
            (&this->devices_);
  this->shift_register_ = 0;
  this->start_target_ = 8;
  this->data_level_ = true;
  std::bitset<17UL>::bitset(&this->bus_state_,0xffffffff);
  this->next_device_id_ = 0;
  this->phase_ = AttentionCapture;
  return;
}

Assistant:

Bus::Bus(HalfCycles clock_speed) : half_cycles_to_microseconds_(1'000'000.0 / clock_speed.as<double>()) {}